

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_meta(ly_ctx *ctx,lyd_node *parent,lys_module *module,char *name,char *val_str,
                   uint32_t options,lyd_meta **meta)

{
  LY_ERR LVar1;
  char *pcVar2;
  lysc_node *plVar3;
  lys_module *plVar4;
  size_t value_len;
  ly_ctx *plVar5;
  char *pcVar6;
  ly_ctx *ctx_00;
  char *name_local;
  size_t pref_len;
  char *prefix;
  size_t local_48;
  size_t name_len;
  char *tmp;
  
  name_local = name;
  if (ctx == (ly_ctx *)0x0 && parent == (lyd_node *)0x0) {
    ctx = (ly_ctx *)0x0;
    pcVar2 = "ctx || parent";
  }
  else if (name == (char *)0x0) {
    pcVar2 = "name";
  }
  else if ((module == (lys_module *)0x0) && (pcVar2 = strchr(name,0x3a), pcVar2 == (char *)0x0)) {
    pcVar2 = "module || strchr(name, \':\')";
  }
  else {
    if (parent != (lyd_node *)0x0 || meta != (lyd_meta **)0x0) {
      if (ctx == (ly_ctx *)0x0 || parent == (lyd_node *)0x0) {
        if (parent != (lyd_node *)0x0) {
          plVar3 = parent->schema;
LAB_0012b1a1:
          if (plVar3 == (lysc_node *)0x0) goto LAB_0012b1c6;
LAB_0012b1a6:
          if ((module != (lys_module *)0x0) &&
             (((ctx_00 = plVar3->module->ctx, ctx_00 != (ly_ctx *)0x0 &&
               (module->ctx != (ly_ctx *)0x0)) && (ctx_00 != module->ctx)))) goto LAB_0012b245;
        }
      }
      else {
        plVar3 = parent->schema;
        if (plVar3 != (lysc_node *)0x0) {
          plVar5 = plVar3->module->ctx;
          if (plVar5 != (ly_ctx *)0x0) {
LAB_0012b19c:
            ctx_00 = ctx;
            if (plVar5 != ctx) goto LAB_0012b245;
            goto LAB_0012b1a1;
          }
          goto LAB_0012b1a6;
        }
        plVar5 = (ly_ctx *)parent[2].schema;
        if (plVar5 != (ly_ctx *)0x0) goto LAB_0012b19c;
LAB_0012b1c6:
        ctx_00 = (ly_ctx *)parent[2].schema;
        if ((ctx_00 != (ly_ctx *)0x0 && module != (lys_module *)0x0) &&
           (ctx_00 != module->ctx && module->ctx != (ly_ctx *)0x0)) goto LAB_0012b245;
      }
      if (ctx == (ly_ctx *)0x0 || module == (lys_module *)0x0) {
        if (ctx == (ly_ctx *)0x0) {
          plVar4 = module;
          if (module == (lys_module *)0x0) {
            if (parent->schema == (lysc_node *)0x0) {
              plVar4 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar4 = parent->schema->module;
            }
          }
          ctx = plVar4->ctx;
        }
      }
      else {
        ctx_00 = ctx;
        if (module->ctx != ctx && module->ctx != (ly_ctx *)0x0) {
LAB_0012b245:
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
      if ((parent == (lyd_node *)0x0) || (parent->schema != (lysc_node *)0x0)) {
        if (meta != (lyd_meta **)0x0) {
          *meta = (lyd_meta *)0x0;
        }
        tmp = name;
        LVar1 = ly_parse_nodeid(&tmp,&prefix,&pref_len,&name_local,&name_len);
        if ((LVar1 == LY_SUCCESS) && (*tmp == '\0')) {
          if ((prefix != (char *)0x0) &&
             (module = ly_ctx_get_module_implemented2
                                 (ctx,prefix,CONCAT44(pref_len._4_4_,(uint)pref_len)),
             module == (lys_module *)0x0)) {
            ly_log(ctx,LY_LLERR,LY_EINVAL,"Module \"%.*s\" not found.",(ulong)(uint)pref_len,prefix)
            ;
            return LY_ENOTFOUND;
          }
          pcVar2 = name_local;
          pcVar6 = "";
          if (val_str != (char *)0x0) {
            pcVar6 = val_str;
          }
          local_48 = name_len;
          value_len = strlen(pcVar6);
          if (parent == (lyd_node *)0x0) {
            plVar3 = (lysc_node *)0x0;
          }
          else {
            plVar3 = parent->schema;
          }
          LVar1 = lyd_create_meta(parent,meta,module,pcVar2,local_48,pcVar6,value_len,'\0',
                                  (byte)options & 2,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x3f3,
                                  plVar3,(byte)options & 0x10,(ly_bool *)0x0);
          return LVar1;
        }
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Metadata name \"%s\" is not valid.",name_local);
        return LY_EINVAL;
      }
      pcVar2 = (char *)parent[1].schema;
      pcVar6 = "Cannot add metadata \"%s\" to an opaque node \"%s\".";
      goto LAB_0012b17b;
    }
    pcVar2 = "parent || meta";
  }
  name = pcVar2;
  pcVar2 = "lyd_new_meta";
  pcVar6 = "Invalid argument %s (%s()).";
LAB_0012b17b:
  ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar6,name,pcVar2);
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_meta(const struct ly_ctx *ctx, struct lyd_node *parent, const struct lys_module *module, const char *name,
        const char *val_str, uint32_t options, struct lyd_meta **meta)
{
    const char *prefix, *tmp;
    size_t pref_len, name_len;
    ly_bool clear_dflt = options & LYD_NEW_META_CLEAR_DFLT;
    ly_bool store_only = options & LYD_NEW_VAL_STORE_ONLY;

    LY_CHECK_ARG_RET(ctx, ctx || parent, name, module || strchr(name, ':'), parent || meta, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    if (!ctx) {
        ctx = module ? module->ctx : LYD_CTX(parent);
    }

    if (parent && !parent->schema) {
        LOGERR(ctx, LY_EINVAL, "Cannot add metadata \"%s\" to an opaque node \"%s\".", name, LYD_NAME(parent));
        return LY_EINVAL;
    }
    if (meta) {
        *meta = NULL;
    }

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Metadata name \"%s\" is not valid.", name);
        return LY_EINVAL;
    }

    /* find the module */
    if (prefix) {
        module = ly_ctx_get_module_implemented2(ctx, prefix, pref_len);
        LY_CHECK_ERR_RET(!module, LOGERR(ctx, LY_EINVAL, "Module \"%.*s\" not found.", (int)pref_len, prefix), LY_ENOTFOUND);
    }

    /* set value if none */
    if (!val_str) {
        val_str = "";
    }

    return lyd_create_meta(parent, meta, module, name, name_len, val_str, strlen(val_str), 0, store_only, NULL, LY_VALUE_JSON,
            NULL, LYD_HINT_DATA, parent ? parent->schema : NULL, clear_dflt, NULL);
}